

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_integer_attribute_decoder.cc
# Opt level: O0

bool __thiscall
draco::SequentialIntegerAttributeDecoder::StoreValues
          (SequentialIntegerAttributeDecoder *this,uint32_t num_values)

{
  DataType DVar1;
  PointAttribute *this_00;
  SequentialAttributeDecoder *in_RDI;
  uint32_t in_stack_0000003c;
  SequentialIntegerAttributeDecoder *in_stack_00000040;
  
  this_00 = SequentialAttributeDecoder::attribute(in_RDI);
  DVar1 = GeometryAttribute::data_type(&this_00->super_GeometryAttribute);
  switch(DVar1) {
  case DT_INT8:
    StoreTypedValues<signed_char>(in_stack_00000040,in_stack_0000003c);
    break;
  case DT_UINT8:
    StoreTypedValues<unsigned_char>(in_stack_00000040,in_stack_0000003c);
    break;
  case DT_INT16:
    StoreTypedValues<short>(in_stack_00000040,in_stack_0000003c);
    break;
  case DT_UINT16:
    StoreTypedValues<unsigned_short>(in_stack_00000040,in_stack_0000003c);
    break;
  case DT_INT32:
    StoreTypedValues<int>(in_stack_00000040,in_stack_0000003c);
    break;
  case DT_UINT32:
    StoreTypedValues<unsigned_int>(in_stack_00000040,in_stack_0000003c);
    break;
  default:
    return false;
  }
  return true;
}

Assistant:

bool SequentialIntegerAttributeDecoder::StoreValues(uint32_t num_values) {
  switch (attribute()->data_type()) {
    case DT_UINT8:
      StoreTypedValues<uint8_t>(num_values);
      break;
    case DT_INT8:
      StoreTypedValues<int8_t>(num_values);
      break;
    case DT_UINT16:
      StoreTypedValues<uint16_t>(num_values);
      break;
    case DT_INT16:
      StoreTypedValues<int16_t>(num_values);
      break;
    case DT_UINT32:
      StoreTypedValues<uint32_t>(num_values);
      break;
    case DT_INT32:
      StoreTypedValues<int32_t>(num_values);
      break;
    default:
      return false;
  }
  return true;
}